

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

int Gia_ManFromBridgeReadPackage(FILE *pFile,int *pType,int *pSize,uchar **ppBuffer)

{
  int iVar1;
  size_t sVar2;
  uchar *__ptr;
  char *__s;
  char Temp [24];
  
  sVar2 = fread(Temp,0x18,1,(FILE *)pFile);
  if ((int)sVar2 == 1) {
    Temp[6] = '\0';
    Temp[0x17] = '\0';
    iVar1 = atoi(Temp);
    *pType = iVar1;
    iVar1 = atoi(Temp + 7);
    *pSize = iVar1;
    __ptr = (uchar *)malloc((long)iVar1);
    *ppBuffer = __ptr;
    sVar2 = fread(__ptr,(long)iVar1,1,(FILE *)pFile);
    if ((int)sVar2 == 1) {
      return 1;
    }
    if (*pSize == 0) {
      return 1;
    }
    __s = "Gia_ManFromBridgeReadPackage();  Error 2: Something is wrong!";
    if (*ppBuffer != (uchar *)0x0) {
      free(*ppBuffer);
      *ppBuffer = (uchar *)0x0;
    }
  }
  else {
    __s = "Gia_ManFromBridgeReadPackage();  Error 1: Something is wrong!";
  }
  puts(__s);
  return 0;
}

Assistant:

int Gia_ManFromBridgeReadPackage( FILE * pFile, int * pType, int * pSize, unsigned char ** ppBuffer )
{
    char Temp[24];
    int RetValue;
    RetValue = fread( Temp, 24, 1, pFile );
    if ( RetValue != 1 )
    {
        printf( "Gia_ManFromBridgeReadPackage();  Error 1: Something is wrong!\n" );
        return 0;
    }
    Temp[6] = 0;
    Temp[23]= 0;

    *pType = atoi( Temp );
    *pSize = atoi( Temp + 7 );

    *ppBuffer = ABC_ALLOC( unsigned char, *pSize );
    RetValue = fread( *ppBuffer, *pSize, 1, pFile );
    if ( RetValue != 1 && *pSize != 0 )
    {
        ABC_FREE( *ppBuffer );
        printf( "Gia_ManFromBridgeReadPackage();  Error 2: Something is wrong!\n" );
        return 0;
    }
    return 1;
}